

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc-send-recv.c
# Opt level: O2

int run_ipc_send_recv_tcp(int inprocess)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  char *pcVar3;
  sockaddr_in addr;
  undefined1 auStack_18 [16];
  
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_18);
  if (iVar1 == 0) {
    ctx.expected_type = UV_TCP;
    uVar2 = uv_default_loop();
    iVar1 = uv_tcp_init(uVar2,0x2b4620);
    if (iVar1 == 0) {
      uVar2 = uv_default_loop();
      iVar1 = uv_tcp_init(uVar2,0x2b4758);
      if (iVar1 == 0) {
        iVar1 = uv_tcp_bind(0x2b4620,auStack_18,0);
        if (iVar1 == 0) {
          iVar1 = uv_tcp_bind(0x2b4758,auStack_18,0);
          if (iVar1 == 0) {
            run_test(inprocess);
            loop = (uv_loop_t *)uv_default_loop();
            close_loop(loop);
            uVar2 = uv_default_loop();
            iVar1 = uv_loop_close(uVar2);
            if (iVar1 == 0) {
              return 0;
            }
            pcVar3 = "0 == uv_loop_close(uv_default_loop())";
            uVar2 = 0x107;
          }
          else {
            pcVar3 = "r == 0";
            uVar2 = 0x102;
          }
        }
        else {
          pcVar3 = "r == 0";
          uVar2 = 0xff;
        }
      }
      else {
        pcVar3 = "r == 0";
        uVar2 = 0xfc;
      }
    }
    else {
      pcVar3 = "r == 0";
      uVar2 = 0xf9;
    }
  }
  else {
    pcVar3 = "0 == uv_ip4_addr(\"127.0.0.1\", TEST_PORT, &addr)";
    uVar2 = 0xf4;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc-send-recv.c"
          ,uVar2,pcVar3);
  abort();
}

Assistant:

static int run_ipc_send_recv_tcp(int inprocess) {
  struct sockaddr_in addr;
  int r;

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  ctx.expected_type = UV_TCP;

  r = uv_tcp_init(uv_default_loop(), &ctx.send.tcp);
  ASSERT(r == 0);

  r = uv_tcp_init(uv_default_loop(), &ctx.send2.tcp);
  ASSERT(r == 0);

  r = uv_tcp_bind(&ctx.send.tcp, (const struct sockaddr*) &addr, 0);
  ASSERT(r == 0);

  r = uv_tcp_bind(&ctx.send2.tcp, (const struct sockaddr*) &addr, 0);
  ASSERT(r == 0);

  r = run_test(inprocess);
  ASSERT(r == 0);

  MAKE_VALGRIND_HAPPY();
  return 0;
}